

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManExploreCut(Sbd_Man_t *p,int Pivot,int nLeaves,int *pLeaves,int *pnStrs,Sbd_Str_t *Strs,
                     int *pFreeVar)

{
  Vec_Int_t *pVVar1;
  sat_solver *psVar2;
  int iVar3;
  abctime aVar4;
  word wVar5;
  abctime aVar6;
  int iVar7;
  int local_15c;
  int local_158;
  int nMoved_1;
  int nMoved;
  int DelayDiff_1;
  word Truth_1;
  int DelayDiff;
  word Truth;
  int RetValue;
  int nIters;
  int iObj;
  int k;
  int i;
  int nNodesDiff2;
  int nNodesDiff1;
  int nNodesDiff;
  int nNodesBot2;
  int nNodesBot1;
  int nNodesBot;
  int nNodesTop;
  int pNodesBot2 [10];
  int aiStack_d8 [2];
  int pNodesBot1 [10];
  int aiStack_a8 [2];
  int pNodesBot [10];
  int aiStack_78 [2];
  int pNodesTop [10];
  int Delay;
  int PivotVar;
  abctime clk;
  Sbd_Str_t *Strs_local;
  int *pnStrs_local;
  int *pLeaves_local;
  int nLeaves_local;
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  Abc_Clock();
  pNodesTop[9] = Vec_IntEntry(p->vObj2Var,Pivot);
  pNodesTop[8] = Vec_IntEntry(p->vLutLevs,Pivot);
  Truth._0_4_ = 0;
  for (Truth._4_4_ = 0; Truth._4_4_ < nLeaves; Truth._4_4_ = Truth._4_4_ + 1) {
    Vec_IntClear(p->vDivSet);
    for (iObj = 0; iObj < nLeaves; iObj = iObj + 1) {
      if ((iObj != (nLeaves + -1) - Truth._4_4_) && (pLeaves[iObj] != -1)) {
        pVVar1 = p->vDivSet;
        iVar3 = Vec_IntEntry(p->vObj2Var,pLeaves[iObj]);
        Vec_IntPush(pVVar1,iVar3);
      }
    }
    iVar3 = Vec_IntSize(p->vDivSet);
    if (nLeaves <= iVar3) {
      __assert_fail("Vec_IntSize(p->vDivSet) < nLeaves",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x519,
                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                   );
    }
    aVar4 = Abc_Clock();
    psVar2 = p->pSat;
    iVar3 = *pFreeVar;
    *pFreeVar = iVar3 + 1;
    wVar5 = Sbd_ManSolve(psVar2,pNodesTop[9],iVar3,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
    aVar6 = Abc_Clock();
    p->timeSat = (aVar6 - aVar4) + p->timeSat;
    if (wVar5 == 0x1234567812345678) {
      printf("Node %d:  Undecided.\n",(ulong)(uint)Pivot);
    }
    else if (wVar5 == 0x8765432187654321) {
      iVar3 = Vec_IntEntry(p->vLutLevs,pLeaves[(nLeaves + -1) - Truth._4_4_]);
      if (-2 < iVar3 - pNodesTop[8]) {
        return 0;
      }
    }
    else {
      pLeaves[(nLeaves + -1) - Truth._4_4_] = -1;
    }
  }
  Vec_IntClear(p->vDivSet);
  for (iObj = 0; iObj < nLeaves; iObj = iObj + 1) {
    if (pLeaves[iObj] != -1) {
      Vec_IntPush(p->vDivSet,pLeaves[iObj]);
    }
  }
  iVar3 = Vec_IntSize(p->vDivSet);
  if (p->pPars->nLutSize < iVar3) {
    iVar3 = Vec_IntSize(p->vDivSet);
    if (iVar3 <= p->pPars->nLutSize) {
      __assert_fail("Vec_IntSize(p->vDivSet) > p->pPars->nLutSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x549,
                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                   );
    }
    nNodesDiff1 = 0;
    nNodesDiff = 0;
    nNodesBot2 = 0;
    nNodesBot1 = 0;
    for (iObj = 0; iVar3 = Vec_IntSize(p->vDivSet), iObj < iVar3; iObj = iObj + 1) {
      iVar3 = Vec_IntEntry(p->vDivSet,iObj);
      iVar7 = Vec_IntEntry(p->vLutLevs,iVar3);
      iVar7 = iVar7 - pNodesTop[8];
      if (-2 < iVar7) break;
      if (iVar7 == -2) {
        aiStack_78[nNodesBot1] = iObj;
        nNodesBot1 = nNodesBot1 + 1;
      }
      else {
        aiStack_a8[nNodesBot2] = iObj;
        if (iVar7 == -3) {
          aiStack_d8[nNodesDiff] = iObj;
          nNodesDiff = nNodesDiff + 1;
          nNodesBot2 = nNodesBot2 + 1;
        }
        else {
          (&nNodesBot)[nNodesDiff1] = iObj;
          nNodesDiff1 = nNodesDiff1 + 1;
          nNodesBot2 = nNodesBot2 + 1;
        }
      }
      pVVar1 = p->vDivSet;
      iVar3 = Vec_IntEntry(p->vObj2Var,iVar3);
      Vec_IntWriteEntry(pVVar1,iObj,iVar3);
    }
    if (nNodesBot2 != nNodesDiff + nNodesDiff1) {
      __assert_fail("nNodesBot == nNodesBot1 + nNodesBot2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x55e,
                    "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                   );
    }
    iVar3 = Vec_IntSize(p->vDivSet);
    if (iObj < iVar3) {
      p_local._4_4_ = 0;
    }
    else if (p->pPars->nLutSize + -1 < nNodesBot1) {
      p_local._4_4_ = 0;
    }
    else {
      iVar3 = Vec_IntSize(p->vDivSet);
      if (iVar3 <= p->pPars->nLutSize * 2 + -1) {
        local_158 = 0;
        if (p->pPars->nLutSize < nNodesBot2) {
          while (p->pPars->nLutSize < nNodesBot2) {
            nNodesBot2 = nNodesBot2 + -1;
            aiStack_78[nNodesBot1] = aiStack_a8[nNodesBot2];
            local_158 = local_158 + 1;
            nNodesBot1 = nNodesBot1 + 1;
          }
          if (nNodesBot2 != p->pPars->nLutSize) {
            __assert_fail("nNodesBot == p->pPars->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                          ,0x56c,
                          "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                         );
          }
        }
        if (p->pPars->nLutSize < nNodesBot2) {
          __assert_fail("nNodesBot <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x56e,
                        "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                       );
        }
        if (p->pPars->nLutSize + -1 < nNodesBot1) {
          __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x56f,
                        "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                       );
        }
        Strs->fLut = 1;
        Strs->nVarIns = p->pPars->nLutSize;
        for (iObj = 0; iObj < nNodesBot1; iObj = iObj + 1) {
          Strs->VarIns[iObj] = aiStack_78[iObj];
        }
        for (; iObj < p->pPars->nLutSize; iObj = iObj + 1) {
          iVar3 = Vec_IntSize(p->vDivSet);
          Strs->VarIns[iObj] = (iVar3 + 1 + iObj) - nNodesBot1;
        }
        Strs->Res = 0;
        Strs[1].fLut = 1;
        Strs[1].nVarIns = nNodesBot2;
        for (iObj = 0; iObj < nNodesBot2; iObj = iObj + 1) {
          Strs[1].VarIns[iObj] = aiStack_a8[iObj];
        }
        Strs[1].Res = 0;
        iVar3 = (p->pPars->nLutSize + -1) - nNodesBot1;
        if ((iVar3 < 0) || (3 < iVar3)) {
          __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x580,
                        "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                       );
        }
        for (nIters = 0; nIters < iVar3; nIters = nIters + 1) {
          Strs[nIters + 2].fLut = 0;
          Strs[nIters + 2].nVarIns = nNodesBot2;
          for (iObj = 0; iObj < nNodesBot2; iObj = iObj + 1) {
            Strs[nIters + 2].VarIns[iObj] = aiStack_a8[iObj];
          }
          Strs[nIters + 2].Res = 0;
        }
        *pnStrs = iVar3 + 2;
        aVar4 = Abc_Clock();
        Truth._0_4_ = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                                       p->vRoots,p->vDivSet,*pnStrs,Strs);
        aVar6 = Abc_Clock();
        p->timeQbf = (aVar6 - aVar4) + p->timeQbf;
        if ((int)Truth != 0) {
          p->nLuts[2] = p->nLuts[2] + 1;
        }
        while (local_158 != 0) {
          nNodesBot1 = nNodesBot1 + -1;
          aiStack_a8[nNodesBot2] = aiStack_78[nNodesBot1];
          local_158 = local_158 + -1;
          nNodesBot2 = nNodesBot2 + 1;
        }
      }
      if ((int)Truth == 0) {
        if (p->pPars->nLutNum < 3) {
          p_local._4_4_ = 0;
        }
        else {
          iVar3 = Vec_IntSize(p->vDivSet);
          if (iVar3 < p->pPars->nLutSize * 2 + -1) {
            p_local._4_4_ = 0;
          }
          else {
            if (nNodesBot1 <= p->pPars->nLutSize + -2) {
              local_15c = 0;
              iVar3 = p->pPars->nLutSize;
              iVar7 = iVar3 * 2;
              if (nNodesBot2 != iVar7 && SBORROW4(nNodesBot2,iVar7) == nNodesBot2 + iVar3 * -2 < 0)
              {
                while (iVar3 = p->pPars->nLutSize, iVar7 = iVar3 * 2,
                      nNodesBot2 != iVar7 &&
                      SBORROW4(nNodesBot2,iVar7) == nNodesBot2 + iVar3 * -2 < 0) {
                  nNodesBot2 = nNodesBot2 + -1;
                  aiStack_78[nNodesBot1] = aiStack_a8[nNodesBot2];
                  local_15c = local_15c + 1;
                  nNodesBot1 = nNodesBot1 + 1;
                }
                if (nNodesBot2 != p->pPars->nLutSize * 2) {
                  __assert_fail("nNodesBot == 2*p->pPars->nLutSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x5a4,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
              }
              if (nNodesBot2 <= p->pPars->nLutSize) {
                __assert_fail("nNodesBot > p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5a6,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              iVar3 = p->pPars->nLutSize;
              iVar7 = iVar3 * 2;
              if (nNodesBot2 != iVar7 && SBORROW4(nNodesBot2,iVar7) == nNodesBot2 + iVar3 * -2 < 0)
              {
                __assert_fail("nNodesBot <= 2*p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5a7,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              if (p->pPars->nLutSize + -2 < nNodesBot1) {
                __assert_fail("nNodesTop <= p->pPars->nLutSize-2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5a8,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              Strs->fLut = 1;
              Strs->nVarIns = p->pPars->nLutSize;
              for (iObj = 0; iObj < nNodesBot1; iObj = iObj + 1) {
                Strs->VarIns[iObj] = aiStack_78[iObj];
              }
              for (; iObj < p->pPars->nLutSize; iObj = iObj + 1) {
                iVar3 = Vec_IntSize(p->vDivSet);
                Strs->VarIns[iObj] = (iVar3 + 1 + iObj) - nNodesBot1;
              }
              Strs->Res = 0;
              Strs[1].fLut = 1;
              Strs[1].nVarIns = p->pPars->nLutSize;
              for (iObj = 0; iObj < Strs[1].nVarIns; iObj = iObj + 1) {
                Strs[1].VarIns[iObj] = aiStack_a8[iObj];
              }
              Strs[1].Res = 0;
              Strs[2].fLut = 1;
              Strs[2].nVarIns = p->pPars->nLutSize;
              for (iObj = 0; iObj < Strs[2].nVarIns; iObj = iObj + 1) {
                Strs[2].VarIns[iObj] = aiStack_a8[(nNodesBot2 - p->pPars->nLutSize) + iObj];
              }
              Strs[2].Res = 0;
              iVar3 = (p->pPars->nLutSize + -2) - nNodesBot1;
              if ((iVar3 < 0) || (2 < iVar3)) {
                __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                              ,0x5bf,
                              "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                             );
              }
              for (nIters = 0; nIters < iVar3; nIters = nIters + 1) {
                Strs[nIters + 3].fLut = 0;
                Strs[nIters + 3].nVarIns = nNodesBot2;
                for (iObj = 0; iObj < nNodesBot2; iObj = iObj + 1) {
                  Strs[nIters + 3].VarIns[iObj] = aiStack_a8[iObj];
                }
                Strs[nIters + 3].Res = 0;
              }
              *pnStrs = iVar3 + 3;
              aVar4 = Abc_Clock();
              Truth._0_4_ = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,
                                             p->vTfo,p->vRoots,p->vDivSet,*pnStrs,Strs);
              aVar6 = Abc_Clock();
              p->timeQbf = (aVar6 - aVar4) + p->timeQbf;
              if ((int)Truth != 0) {
                p->nLuts[3] = p->nLuts[3] + 1;
              }
              while (local_15c != 0) {
                nNodesBot1 = nNodesBot1 + -1;
                aiStack_a8[nNodesBot2] = aiStack_78[nNodesBot1];
                local_15c = local_15c + -1;
                nNodesBot2 = nNodesBot2 + 1;
              }
            }
            if ((int)Truth == 0) {
              if (nNodesDiff + nNodesBot1 <= p->pPars->nLutSize * 2 + -2) {
                if (p->pPars->nLutSize < nNodesDiff1) {
                  while (p->pPars->nLutSize < nNodesDiff1) {
                    nNodesDiff1 = nNodesDiff1 + -1;
                    aiStack_d8[nNodesDiff] = (&nNodesBot)[nNodesDiff1];
                    nNodesDiff = nNodesDiff + 1;
                  }
                  if (nNodesDiff1 != p->pPars->nLutSize) {
                    __assert_fail("nNodesBot2 == p->pPars->nLutSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                  ,0x5dd,
                                  "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                 );
                  }
                }
                if (p->pPars->nLutSize + -1 < nNodesDiff) {
                  while (p->pPars->nLutSize + -1 < nNodesDiff) {
                    nNodesDiff = nNodesDiff + -1;
                    aiStack_78[nNodesBot1] = aiStack_d8[nNodesDiff];
                    nNodesBot1 = nNodesBot1 + 1;
                  }
                  if (nNodesDiff != p->pPars->nLutSize + -1) {
                    __assert_fail("nNodesBot1 == p->pPars->nLutSize-1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                  ,0x5e3,
                                  "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                                 );
                  }
                }
                if (p->pPars->nLutSize < nNodesDiff1) {
                  __assert_fail("nNodesBot2 <= p->pPars->nLutSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x5e5,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
                if (p->pPars->nLutSize + -1 < nNodesDiff) {
                  __assert_fail("nNodesBot1 <= p->pPars->nLutSize-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x5e6,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
                if (p->pPars->nLutSize + -1 < nNodesBot1) {
                  __assert_fail("nNodesTop <= p->pPars->nLutSize-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x5e7,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
                Strs->fLut = 1;
                Strs->nVarIns = p->pPars->nLutSize;
                for (iObj = 0; iObj < nNodesBot1; iObj = iObj + 1) {
                  Strs->VarIns[iObj] = aiStack_78[iObj];
                }
                iVar3 = Vec_IntSize(p->vDivSet);
                Strs->VarIns[iObj] = iVar3 + 1;
                while (iObj = iObj + 1, iObj < p->pPars->nLutSize) {
                  iVar3 = Vec_IntSize(p->vDivSet);
                  Strs->VarIns[iObj] = (iVar3 + 2 + iObj) - nNodesBot1;
                }
                Strs->Res = 0;
                iVar3 = (p->pPars->nLutSize + -1) - nNodesBot1;
                Strs[1].fLut = 1;
                Strs[1].nVarIns = p->pPars->nLutSize;
                for (iObj = 0; iObj < nNodesDiff; iObj = iObj + 1) {
                  Strs[1].VarIns[iObj] = aiStack_d8[iObj];
                }
                iVar7 = Vec_IntSize(p->vDivSet);
                Strs[1].VarIns[iObj] = iVar7 + 2;
                while (iObj = iObj + 1, iObj < p->pPars->nLutSize) {
                  iVar7 = Vec_IntSize(p->vDivSet);
                  Strs[1].VarIns[iObj] = (iVar7 + 2 + iVar3 + iObj) - nNodesDiff;
                }
                Strs[1].Res = 0;
                iVar7 = p->pPars->nLutSize;
                Strs[2].fLut = 1;
                Strs[2].nVarIns = nNodesDiff1;
                for (iObj = 0; iObj < Strs[2].nVarIns; iObj = iObj + 1) {
                  Strs[2].VarIns[iObj] = (&nNodesBot)[iObj];
                }
                Strs[2].Res = 0;
                iVar7 = iVar3 + ((iVar7 + -1) - nNodesDiff);
                if ((iVar7 < 0) || (3 < iVar7)) {
                  __assert_fail("nNodesDiff >= 0 && nNodesDiff <= 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                                ,0x604,
                                "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                               );
                }
                for (nIters = 0; nIters < iVar7; nIters = nIters + 1) {
                  Strs[nIters + 3].fLut = 0;
                  Strs[nIters + 3].nVarIns = nNodesDiff1;
                  for (iObj = 0; iObj < nNodesDiff1; iObj = iObj + 1) {
                    Strs[nIters + 3].VarIns[iObj] = (&nNodesBot)[iObj];
                  }
                  Strs[nIters + 3].Res = 0;
                  if (nIters < iVar3) {
                    Strs[nIters + 3].nVarIns = nNodesDiff + Strs[nIters + 3].nVarIns;
                    for (iObj = 0; iObj < nNodesDiff; iObj = iObj + 1) {
                      Strs[nIters + 3].VarIns[nNodesDiff1 + iObj] = aiStack_d8[iObj];
                    }
                  }
                }
                *pnStrs = iVar7 + 3;
                aVar4 = Abc_Clock();
                Truth._0_4_ = Sbd_ProblemSolve(p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,
                                               p->vTfo,p->vRoots,p->vDivSet,*pnStrs,Strs);
                aVar6 = Abc_Clock();
                p->timeQbf = (aVar6 - aVar4) + p->timeQbf;
                if ((int)Truth != 0) {
                  p->nLuts[4] = p->nLuts[4] + 1;
                }
              }
              p_local._4_4_ = (int)Truth;
            }
            else {
              p_local._4_4_ = (int)Truth;
            }
          }
        }
      }
      else {
        p_local._4_4_ = (int)Truth;
      }
    }
  }
  else {
    *pnStrs = 1;
    for (iObj = 0; iVar3 = Vec_IntSize(p->vDivSet), iObj < iVar3; iObj = iObj + 1) {
      iVar3 = Vec_IntEntry(p->vDivSet,iObj);
      pVVar1 = p->vDivSet;
      iVar3 = Vec_IntEntry(p->vObj2Var,iVar3);
      Vec_IntWriteEntry(pVVar1,iObj,iVar3);
    }
    aVar4 = Abc_Clock();
    psVar2 = p->pSat;
    iVar3 = *pFreeVar;
    *pFreeVar = iVar3 + 1;
    wVar5 = Sbd_ManSolve(psVar2,pNodesTop[9],iVar3,p->vDivSet,p->vDivVars,p->vDivValues,p->vLits);
    aVar6 = Abc_Clock();
    p->timeSat = (aVar6 - aVar4) + p->timeSat;
    if (wVar5 == 0x8765432187654321) {
      printf("The cut at node %d is not topological.\n",(ulong)(uint)p->Pivot);
      p_local._4_4_ = 0;
    }
    else {
      if ((wVar5 == 0x1234567812345678) || (wVar5 == 0x8765432187654321)) {
        __assert_fail("Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                      ,0x53e,
                      "int Sbd_ManExploreCut(Sbd_Man_t *, int, int, int *, int *, Sbd_Str_t *, int *)"
                     );
      }
      Strs->fLut = 1;
      iVar3 = Vec_IntSize(p->vDivSet);
      Strs->nVarIns = iVar3;
      for (iObj = 0; iObj < Strs->nVarIns; iObj = iObj + 1) {
        Strs->VarIns[iObj] = iObj;
      }
      Strs->Res = wVar5;
      p->nLuts[1] = p->nLuts[1] + 1;
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Sbd_ManExploreCut( Sbd_Man_t * p, int Pivot, int nLeaves, int * pLeaves, int * pnStrs, Sbd_Str_t * Strs, int * pFreeVar )
{
    abctime clk = Abc_Clock();
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int Delay = Vec_IntEntry( p->vLutLevs, Pivot );
    int pNodesTop[SBD_DIV_MAX], pNodesBot[SBD_DIV_MAX], pNodesBot1[SBD_DIV_MAX], pNodesBot2[SBD_DIV_MAX];
    int nNodesTop = 0, nNodesBot = 0, nNodesBot1 = 0, nNodesBot2 = 0, nNodesDiff = 0, nNodesDiff1 = 0, nNodesDiff2 = 0;
    int i, k, iObj, nIters, RetValue = 0;

    // try to remove fanins
    for ( nIters = 0; nIters < nLeaves; nIters++ )
    {
        word Truth;
        // try to remove one variable from divisors
        Vec_IntClear( p->vDivSet );
        for ( i = 0; i < nLeaves; i++ )
            if ( i != nLeaves-1-nIters && pLeaves[i] != -1 )
                Vec_IntPush( p->vDivSet, Vec_IntEntry(p->vObj2Var, pLeaves[i]) );
        assert( Vec_IntSize(p->vDivSet) < nLeaves );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( Truth == SBD_SAT_SAT )
        {
            int DelayDiff = Vec_IntEntry(p->vLutLevs, pLeaves[nLeaves-1-nIters]) - Delay;
            if ( DelayDiff > -2 )
                return 0;
        }
        else
            pLeaves[nLeaves-1-nIters] = -1;
    }
    Vec_IntClear( p->vDivSet );
    for ( i = 0; i < nLeaves; i++ )
        if ( pLeaves[i] != -1 )
            Vec_IntPush( p->vDivSet, pLeaves[i] );
    //printf( "Reduced %d -> %d\n", nLeaves, Vec_IntSize(p->vDivSet) );
    if ( Vec_IntSize(p->vDivSet) <= p->pPars->nLutSize )
    {
        word Truth;
        *pnStrs = 1;
        // remap divisors
        Vec_IntForEachEntry( p->vDivSet, iObj, i )
            Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
        // compute truth table
        clk = Abc_Clock();
        Truth = Sbd_ManSolve( p->pSat, PivotVar, (*pFreeVar)++, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;
        if ( Truth == SBD_SAT_SAT )
        {
            printf( "The cut at node %d is not topological.\n", p->Pivot );
            return 0;
        }
        assert( Truth != SBD_SAT_UNDEC && Truth != SBD_SAT_SAT );
        // create structure
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        p->nLuts[1]++;
        //Extra_PrintBinary( stdout, (unsigned *)&Truth, 1 << Strs->nVarIns ), printf( "\n" );
        return 1;
    }
    assert( Vec_IntSize(p->vDivSet) > p->pPars->nLutSize );

    // count number of nodes on each level
    nNodesTop = nNodesBot = nNodesBot1 = nNodesBot2 = 0;
    Vec_IntForEachEntry( p->vDivSet, iObj, i )
    {
        int DelayDiff = Vec_IntEntry(p->vLutLevs, iObj) - Delay;
        if ( DelayDiff > -2 )
            break;
        if ( DelayDiff == -2 )
            pNodesTop[nNodesTop++] = i;
        else // if ( DelayDiff < -2 )
        {
            pNodesBot[nNodesBot++] = i;
            if ( DelayDiff == -3 )
                pNodesBot1[nNodesBot1++] = i;
            else // if ( DelayDiff < -3 )
                pNodesBot2[nNodesBot2++] = i;
        }
        Vec_IntWriteEntry( p->vDivSet, i, Vec_IntEntry(p->vObj2Var, iObj) );
    }
    assert( nNodesBot == nNodesBot1 + nNodesBot2 );
    if ( i < Vec_IntSize(p->vDivSet) )
        return 0;
    if ( nNodesTop > p->pPars->nLutSize-1 )
        return 0;

    // try 44
    if ( Vec_IntSize(p->vDivSet) <= 2*p->pPars->nLutSize-1 )
    {
        int nMoved = 0;
        if ( nNodesBot > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == p->pPars->nLutSize );
        }
        assert( nNodesBot <= p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = nNodesBot;
        for ( i = 0; i < nNodesBot; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        nNodesDiff = p->pPars->nLutSize-1 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[2+k].fLut = 0;
            Strs[2+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[2+k].VarIns[i] = pNodesBot[i];
            Strs[2+k].Res = 0;
        }

        *pnStrs = 2 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[2]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }

    if ( RetValue )
        return RetValue;
    if ( p->pPars->nLutNum < 3 )
        return 0;
    if ( Vec_IntSize(p->vDivSet) < 2*p->pPars->nLutSize-1 )
        return 0;

    // try 444 -- LUT(LUT, LUT)
    if ( nNodesTop <= p->pPars->nLutSize-2 )
    {
        int nMoved = 0;
        if ( nNodesBot > 2*p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot > 2*p->pPars->nLutSize )
                pNodesTop[nNodesTop++] = pNodesBot[--nNodesBot], nMoved++;
            assert( nNodesBot == 2*p->pPars->nLutSize );
        }
        assert( nNodesBot > p->pPars->nLutSize );
        assert( nNodesBot <= 2*p->pPars->nLutSize );
        assert( nNodesTop <= p->pPars->nLutSize-2 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+1 + i-nNodesTop;
        Strs[0].Res = 0;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[1].nVarIns; i++ )
            Strs[1].VarIns[i] = pNodesBot[i];
        Strs[1].Res = 0;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot[nNodesBot-p->pPars->nLutSize+i];
        Strs[2].Res = 0;

        nNodesDiff = p->pPars->nLutSize-2 - nNodesTop;
        assert( nNodesDiff >= 0 && nNodesDiff <= 2 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot;
            for ( i = 0; i < nNodesBot; i++ )
                Strs[3+k].VarIns[i] = pNodesBot[i];
            Strs[3+k].Res = 0;
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[3]++;

        while ( nMoved-- )
            pNodesBot[nNodesBot++] = pNodesTop[--nNodesTop];
    }
    if ( RetValue )
        return RetValue;

    // try 444 -- LUT(LUT(LUT))
    if ( nNodesBot1 + nNodesTop <= 2*p->pPars->nLutSize-2 )
    {
        if ( nNodesBot2 > p->pPars->nLutSize ) // need to move bottom left-over to the top
        {
            while ( nNodesBot2 > p->pPars->nLutSize )
                pNodesBot1[nNodesBot1++] = pNodesBot2[--nNodesBot2];
            assert( nNodesBot2 == p->pPars->nLutSize );
        }
        if ( nNodesBot1 > p->pPars->nLutSize-1 ) // need to move bottom left-over to the top
        {
            while ( nNodesBot1 > p->pPars->nLutSize-1 )
                pNodesTop[nNodesTop++] = pNodesBot1[--nNodesBot1];
            assert( nNodesBot1 == p->pPars->nLutSize-1 );
        }
        assert( nNodesBot2 <= p->pPars->nLutSize );
        assert( nNodesBot1 <= p->pPars->nLutSize-1 );
        assert( nNodesTop <= p->pPars->nLutSize-1 );

        Strs[0].fLut = 1;
        Strs[0].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesTop; i++ )
            Strs[0].VarIns[i] = pNodesTop[i];
        Strs[0].VarIns[i++] = Vec_IntSize(p->vDivSet)+1;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[0].VarIns[i] = Vec_IntSize(p->vDivSet)+2 + i-nNodesTop;
        Strs[0].Res = 0;
        nNodesDiff1 = p->pPars->nLutSize-1 - nNodesTop;

        Strs[1].fLut = 1;
        Strs[1].nVarIns = p->pPars->nLutSize;
        for ( i = 0; i < nNodesBot1; i++ )
            Strs[1].VarIns[i] = pNodesBot1[i];
        Strs[1].VarIns[i++] = Vec_IntSize(p->vDivSet)+2;
        for ( ; i < p->pPars->nLutSize; i++ )
            Strs[1].VarIns[i] = Vec_IntSize(p->vDivSet)+2+nNodesDiff1 + i-nNodesBot1;
        Strs[1].Res = 0;
        nNodesDiff2 = p->pPars->nLutSize-1 - nNodesBot1;

        Strs[2].fLut = 1;
        Strs[2].nVarIns = nNodesBot2;
        for ( i = 0; i < Strs[2].nVarIns; i++ )
            Strs[2].VarIns[i] = pNodesBot2[i];
        Strs[2].Res = 0;

        nNodesDiff = nNodesDiff1 + nNodesDiff2;
        assert( nNodesDiff >= 0 && nNodesDiff <= 3 );
        for ( k = 0; k < nNodesDiff; k++ )
        {
            Strs[3+k].fLut = 0;
            Strs[3+k].nVarIns = nNodesBot2;
            for ( i = 0; i < nNodesBot2; i++ )
                Strs[3+k].VarIns[i] = pNodesBot2[i];
            Strs[3+k].Res = 0;
            if ( k >= nNodesDiff1 )
                continue;
            Strs[3+k].nVarIns += nNodesBot1;
            for ( i = 0; i < nNodesBot1; i++ )
                Strs[3+k].VarIns[nNodesBot2 + i] = pNodesBot1[i];
        }

        *pnStrs = 3 + nNodesDiff;
        clk = Abc_Clock();
        RetValue = Sbd_ProblemSolve( p->pGia, p->vMirrors,   Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots,   p->vDivSet, *pnStrs, Strs );
        p->timeQbf += Abc_Clock() - clk;
        if ( RetValue ) 
            p->nLuts[4]++;
    }
    return RetValue;
}